

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EulerAngles.h
# Opt level: O2

void __thiscall
KDIS::PDU::Entity_State_Update_PDU::SetEntityOrientation
          (Entity_State_Update_PDU *this,EulerAngles *EO)

{
  KFLOAT32 KVar1;
  
  (this->m_EntityOrientation).m_f32Phi = EO->m_f32Phi;
  KVar1 = EO->m_f32Theta;
  (this->m_EntityOrientation).m_f32Psi = EO->m_f32Psi;
  (this->m_EntityOrientation).m_f32Theta = KVar1;
  return;
}

Assistant:

class KDIS_EXPORT EulerAngles : public DataTypeBase
{
protected:

    KFLOAT32 m_f32Psi;

    KFLOAT32 m_f32Theta;

    KFLOAT32 m_f32Phi;

public:

    static const KUINT16 EULER_ANGLES_SIZE = 12;

    EulerAngles();

    // In Radians
    EulerAngles( KFLOAT32 Psi, KFLOAT32 Theta, KFLOAT32 Phi );

    EulerAngles(KDataStream &stream) noexcept(false);

    virtual ~EulerAngles();

    //************************************
    // FullName:    KDIS::DATA_TYPE::EulerAngles::SetPsi
    //              KDIS::DATA_TYPE::EulerAngles::GetPsi
    // Description: Radians / Degrees
    // Parameter:   KFLOAT32 Psi
    //************************************
    void SetPsiInRadians( KFLOAT32 Psi );
    KFLOAT32 GetPsiInRadians() const;
    void SetPsiInDegrees( KFLOAT32 Psi );
    KFLOAT32 GetPsiInDegrees() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EulerAngles::SetTheta
    //              KDIS::DATA_TYPE::EulerAngles::GetTheta
    // Description: Radians / Degrees
    // Parameter:   KFLOAT32 Theta
    //************************************
    void SetThetaInRadians( KFLOAT32 Theta );
    KFLOAT32 GetThetaInRadians() const;
    void SetThetaInDegrees( KFLOAT32 Theta );
    KFLOAT32 GetThetaInDegrees() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EulerAngles::SetPhi
    //              KDIS::DATA_TYPE::EulerAngles::GetPhi
    // Description: Radians / Degrees
    // Parameter:   KFLOAT32 Phi
    //************************************
    void SetPhiInRadians( KFLOAT32 Phi );
    KFLOAT32 GetPhiInRadians() const;
    void SetPhiInDegrees( KFLOAT32 Phi );
    KFLOAT32 GetPhiInDegrees() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EulerAngles::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EulerAngles::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::EulerAngles::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const EulerAngles & Value ) const;
    KBOOL operator != ( const EulerAngles & Value ) const;
    EulerAngles operator * ( const EulerAngles & Value ) const;
    EulerAngles operator * ( KFLOAT64 Value ) const ;
    EulerAngles operator + ( const EulerAngles & Value ) const;
    EulerAngles & operator += ( const EulerAngles & Value );
    EulerAngles operator - ( const EulerAngles & Value ) const;
    EulerAngles & operator -= ( const EulerAngles & Value );

    // Valid values 0 - Psi, 1 - Theta, 2 - Phi. throws OUT_OF_BOUNDS exception for any other value.
    KFLOAT32 &operator[](KUINT16 i) noexcept(false);

    const KFLOAT32 &operator[](KUINT16 i) const noexcept(false);
}